

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmGen12TextureCalc::Get2DMipMapHeight(GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  GMM_PLATFORM_INFO *pGVar4;
  undefined4 extraout_var;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  GMM_PLATFORM_INFO *local_58;
  ulong local_50;
  ulong local_48;
  uint local_3c;
  uint32_t local_38;
  uint32_t CompressHeight;
  
  pGVar4 = GmmGetPlatformInfo((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                              super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext);
  CompressHeight._3_1_ =
       GmmIsCompressed((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                       super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext,pTexInfo->Format
                      );
  uVar2 = pTexInfo->BaseHeight;
  local_38 = pTexInfo->MaxLod;
  uVar7 = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            ((GmmTextureCalc *)this,pTexInfo->Format,&local_68,&local_3c,&local_64);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (pTexInfo->MSAA).NumSamples;
  }
  uVar2 = GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,uVar2,uVar7,uVar3);
  local_48 = CONCAT44(extraout_var,uVar2);
  if (CompressHeight._3_1_ != '\0') {
    local_48 = (ulong)uVar2 / (ulong)local_3c;
  }
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) == 0) ||
     (((pTexInfo->Alignment).MipTailStartLod != 0 && (pTexInfo->MaxLod != 0)))) {
    local_58 = pGVar4;
    local_50 = (ulong)uVar7;
    if (local_38 == 0) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      _CompressWidth = pGVar4->TileInfo;
      uVar6 = 1;
      uVar8 = 0;
      uVar7 = 0;
      do {
        uVar2 = (uint32_t)uVar6;
        if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) == 0) ||
           (uVar2 != (pTexInfo->Alignment).MipTailStartLod)) {
          uVar3 = (*(this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                    super_GmmGen9TextureCalc.super_GmmTextureCalc._vptr_GmmTextureCalc[0x19])
                            (this,pTexInfo,uVar6);
          if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
            uVar5 = 1;
          }
          else {
            uVar5 = (pTexInfo->MSAA).NumSamples;
          }
          uVar3 = GmmTextureCalc::ExpandHeight
                            ((GmmTextureCalc *)this,uVar3,(uint32_t)local_50,uVar5);
          if (CompressHeight._3_1_ == '\0') {
            bVar1 = false;
          }
          else {
            bVar1 = false;
            uVar3 = uVar3 / local_3c;
          }
        }
        else {
          uVar3 = _CompressWidth[pTexInfo->TileMode].LogicalTileHeight;
          bVar1 = true;
        }
        uVar5 = uVar3;
        if (uVar2 == 1) {
          uVar5 = 0;
          uVar8 = uVar3;
        }
        uVar7 = uVar7 + uVar5;
      } while ((!bVar1) && (uVar6 = (ulong)(uVar2 + 1), uVar2 + 1 <= local_38));
    }
    if (((ulong)(pTexInfo->Flags).Info & 0x106000000000) == 0) {
      if (uVar8 < uVar7) {
        uVar8 = uVar7;
      }
      local_48 = (ulong)((int)local_48 + ((int)local_50 + -1 + uVar8 & -(int)local_50));
    }
    else {
      if (uVar7 < uVar8) {
        uVar7 = uVar8;
      }
      uVar2 = local_58->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      local_48 = (ulong)(-uVar2 & (uVar2 - 1) + (int)local_48 + uVar7);
    }
  }
  return (uint32_t)local_48;
}

Assistant:

uint32_t GmmLib::GmmGen12TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}